

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalDecoder::Init
          (MeshEdgebreakerTraversalDecoder *this,MeshEdgebreakerDecoderImplInterface *decoder)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  this->decoder_impl_ = decoder;
  iVar6 = (*decoder->_vptr_MeshEdgebreakerDecoderImplInterface[8])(decoder);
  plVar1 = *(long **)(CONCAT44(extraout_var,iVar6) + 0x40);
  lVar2 = *plVar1;
  lVar3 = plVar1[2];
  iVar6 = (*decoder->_vptr_MeshEdgebreakerDecoderImplInterface[8])(decoder);
  lVar4 = *(long *)(CONCAT44(extraout_var_00,iVar6) + 0x40);
  lVar5 = *(long *)(lVar4 + 8);
  lVar4 = *(long *)(lVar4 + 0x10);
  iVar6 = (*decoder->_vptr_MeshEdgebreakerDecoderImplInterface[8])(decoder);
  DecoderBuffer::Init(&this->buffer_,(char *)(lVar2 + lVar3),lVar5 - lVar4,
                      *(uint16_t *)(*(long *)(CONCAT44(extraout_var_01,iVar6) + 0x40) + 0x32));
  return;
}

Assistant:

void Init(MeshEdgebreakerDecoderImplInterface *decoder) {
    decoder_impl_ = decoder;
    buffer_.Init(decoder->GetDecoder()->buffer()->data_head(),
                 decoder->GetDecoder()->buffer()->remaining_size(),
                 decoder->GetDecoder()->buffer()->bitstream_version());
  }